

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_Pixmap *pxm,int XP,int YP,int WP,int HP,int cx,int cy)

{
  BOX *pBVar1;
  int srcy;
  int iVar2;
  Fl_Region p_Var3;
  Fl_Region p_Var4;
  int y;
  int x;
  long lVar5;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int Y;
  int X;
  int H;
  int W;
  
  iVar2 = Fl_Pixmap::prepare(pxm,XP,YP,WP,HP,&cx,&cy,&X,&Y,&W,&H);
  if (iVar2 == 0) {
    if (pxm->mask_ == 0) {
      copy_offscreen(this,X,Y,W,H,(ulong)pxm->id_,cx,cy);
    }
    else {
      XSetClipMask(fl_display,fl_gc);
      srcy = cy;
      iVar2 = cx;
      XSetClipOrigin(fl_display,fl_gc,X - cx,Y - cy);
      p_Var3 = Fl_Graphics_Driver::clip_region(&this->super_Fl_Graphics_Driver);
      if (p_Var3 == (Fl_Region)0x0) {
        copy_offscreen(this,X,Y,W,H,(ulong)pxm->id_,iVar2,srcy);
      }
      else {
        p_Var3 = XRectangleRegion(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0,0x1c32c0);
        p_Var4 = Fl_Graphics_Driver::clip_region(&this->super_Fl_Graphics_Driver);
        XIntersectRegion(p_Var3,p_Var4,p_Var3);
        if (0 < p_Var3->numRects) {
          lVar5 = 0;
          do {
            pBVar1 = p_Var3->rects;
            x = (int)pBVar1[lVar5].x1;
            y = (int)pBVar1[lVar5].y1;
            copy_offscreen(this,x,y,pBVar1[lVar5].x2 - x,pBVar1[lVar5].y2 - y,(ulong)pxm->id_,
                           (x + iVar2) - X,(srcy + y) - Y);
            lVar5 = lVar5 + 1;
          } while (lVar5 < p_Var3->numRects);
        }
        XDestroyRegion(p_Var3);
      }
      XSetClipOrigin(fl_display,fl_gc,0,0);
      Fl_Graphics_Driver::restore_clip(&this->super_Fl_Graphics_Driver);
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_Pixmap *pxm, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  if (pxm->prepare(XP, YP, WP, HP, cx, cy, X, Y, W, H)) return;
  if (pxm->mask_) {
    // make X use the bitmap as a mask:
    XSetClipMask(fl_display, fl_gc, pxm->mask_);
    XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    if (clip_region()) {
      // At this point, XYWH is the bounding box of the intersection between
      // the current clip region and the (portion of the) pixmap we have to draw.
      // The current clip region is often a rectangle. But, when a window with rounded
      // corners is moved above another window, expose events may create a complex clip
      // region made of several (e.g., 10) rectangles. We have to draw only in the clip
      // region, and also to mask out the transparent pixels of the image. This can't
      // be done in a single Xlib call for a multi-rectangle clip region. Thus, we
      // process each rectangle of the intersection between the clip region and XYWH.
      // See also STR #3206.
      Region r = XRectangleRegion(X,Y,W,H);
      XIntersectRegion(r, clip_region(), r);
      int X1, Y1, W1, H1;
      for (int i = 0; i < r->numRects; i++) {
        X1 = r->rects[i].x1;
        Y1 = r->rects[i].y1;
        W1 = r->rects[i].x2 - r->rects[i].x1;
        H1 = r->rects[i].y2 - r->rects[i].y1;
        copy_offscreen(X1, Y1, W1, H1, pxm->id_, cx + (X1 - X), cy + (Y1 - Y));
      }
      XDestroyRegion(r);
    } else {
      copy_offscreen(X, Y, W, H, pxm->id_, cx, cy);
    }
    // put the old clip region back
    XSetClipOrigin(fl_display, fl_gc, 0, 0);
    restore_clip();
  }
  else copy_offscreen(X, Y, W, H, pxm->id_, cx, cy);
}